

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cCullDistanceTests.cpp
# Opt level: O2

IterateResult __thiscall glcts::CullDistance::APICoverageTest::iterate(APICoverageTest *this)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  char cVar3;
  string *psVar4;
  GLuint *pGVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  ContextType CVar10;
  GLenum GVar11;
  undefined4 extraout_var;
  ulong uVar12;
  char *pcVar13;
  _Alloc_hider te_body_00;
  int *value;
  long lVar14;
  long lVar15;
  MessageBuilder *pMVar16;
  TestError *pTVar17;
  NotSupportedError *this_00;
  _run *p_Var18;
  _Alloc_hider fs_body_00;
  GLuint *pGVar19;
  char *pcVar20;
  _Alloc_hider cs_body_00;
  int iVar21;
  qpTestResult testResult;
  GLuint GVar22;
  long lVar23;
  TestContext *this_01;
  _Alloc_hider gs_body_00;
  _Alloc_hider tc_body_00;
  _Alloc_hider vs_body_00;
  GLuint n_pair;
  long lVar24;
  GLint result_value;
  long local_378;
  GLint gl_max_combined_clip_and_cull_distances_value;
  GLint *local_368;
  GLint *local_360;
  GLint gl_max_cull_distances_value;
  GLuint *local_350;
  GLuint *local_348;
  long local_340;
  GLuint *local_338;
  long local_330;
  Functions *local_328;
  _shader_body *local_320;
  _run runs [2];
  _shader_body shader_bodies [6];
  string te_body;
  string tc_body;
  string gs_body;
  string fs_body;
  string cs_body;
  GLint clear_values [4];
  string vs_body;
  Functions *gl;
  
  iVar9 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  gl = (Functions *)CONCAT44(extraout_var,iVar9);
  bVar6 = glu::ContextInfo::isExtensionSupported
                    (((this->super_TestCase).m_context)->m_contextInfo,"GL_ARB_cull_distance");
  if (!bVar6) {
    CVar10.super_ApiType.m_bits =
         (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
    bVar6 = glu::contextSupports(CVar10,(ApiType)0x154);
    if (!bVar6) {
      this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)clear_values,"GL_ARB_cull_distance is not supported",
                 (allocator<char> *)shader_bodies);
      tcu::NotSupportedError::NotSupportedError(this_00,(string *)clear_values);
      __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  gl_max_cull_distances_value = 0;
  gl_max_combined_clip_and_cull_distances_value = 0;
  (*gl->getIntegerv)(0x82f9,&gl_max_cull_distances_value);
  GVar11 = (*gl->getError)();
  if (GVar11 == 0) {
    (*gl->getIntegerv)(0x82fa,&gl_max_combined_clip_and_cull_distances_value);
    GVar11 = (*gl->getError)();
    if (GVar11 == 0) {
      (*gl->genBuffers)(1,&this->m_bo_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenBuffers() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1dc);
      (*gl->genFramebuffers)(1,&this->m_fbo_draw_id);
      (*gl->genFramebuffers)(1,&this->m_fbo_read_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenFramebuffers() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e0);
      local_348 = &this->m_cs_to_id;
      (*gl->genTextures)(1,local_348);
      local_350 = &this->m_fbo_draw_to_id;
      (*gl->genTextures)(1,local_350);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenTextures() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e4);
      (*gl->genVertexArrays)(1,&this->m_vao_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glGenVertexArrays() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1e7);
      (*gl->bindVertexArray)(this->m_vao_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindVertexArray() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1ea);
      (*gl->bindBuffer)(0x8c8e,this->m_bo_id);
      (*gl->bindBufferBase)(0x8c8e,0,this->m_bo_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindBuffer() or glBindBufferBase() call(s) failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1ef);
      (*gl->bufferData)(0x8c8e,0x40,(void *)0x0,0x88e4);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBufferData() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x1f2);
      iVar9 = 2;
      while( true ) {
        GVar22 = *local_348;
        if (iVar9 == 0) break;
        if (iVar9 != 2) {
          GVar22 = *local_350;
        }
        (*gl->bindTexture)(0xde1,GVar22);
        GVar11 = (*gl->getError)();
        glu::checkError(GVar11,"glBindTexture() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x1f7);
        (*gl->texStorage2D)(0xde1,1,0x8235,1,1);
        GVar11 = (*gl->getError)();
        glu::checkError(GVar11,"glTexStorage2D() call failed.",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                        ,0x1fc);
        iVar9 = iVar9 + -1;
      }
      (*gl->bindImageTexture)(0,GVar22,0,'\0',0,0x88b9,0x8235);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindImageTexture() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x204);
      (*gl->bindFramebuffer)(0x8ca9,this->m_fbo_draw_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x207);
      (*gl->framebufferTexture2D)(0x8ca9,0x8ce0,0xde1,this->m_fbo_draw_to_id,0);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glFramebufferTexture2D() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x20a);
      (*gl->bindFramebuffer)(0x8ca8,this->m_fbo_read_id);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glBindFramebuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x20d);
      (*gl->viewport)(0,0,1,1);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glViewport() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x213);
      (*gl->pixelStorei)(0xd05,1);
      GVar11 = (*gl->getError)();
      glu::checkError(GVar11,"glPixelStorei() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                      ,0x216);
      runs[0].essl_token_value = "gl_MaxCullDistances";
      runs[0].gl_enum = 0x82f9;
      runs[0].gl_value = gl_max_cull_distances_value;
      runs[0].min_value = 8;
      runs[0].name = "GL_MAX_CULL_DISTANCES";
      runs[1].essl_token_value = "gl_MaxCombinedClipAndCullDistances";
      runs[1].gl_enum = 0x82fa;
      runs[1].gl_value = gl_max_combined_clip_and_cull_distances_value;
      runs[1].name = "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES";
      local_338 = &this->m_po_id;
      lVar15 = 0;
      local_328 = gl;
      runs[1].min_value = runs[0].min_value;
      while (lVar15 != 2) {
        p_Var18 = runs + lVar15;
        local_360 = &runs[lVar15].gl_value;
        local_368 = &runs[lVar15].min_value;
        lVar14 = 0;
        local_340 = lVar15;
LAB_00919430:
        if (lVar14 != 5) {
          bVar6 = iterate::stages[lVar14].use_cs;
          local_330 = lVar14;
          if (bVar6 != true) {
LAB_0091949f:
            bVar7 = iterate::stages[lVar14].use_tc;
            if ((bVar7 != false) || (iterate::stages[lVar14].use_te == true)) {
              CVar10.super_ApiType.m_bits =
                   (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext
                              [2])();
              bVar8 = glu::contextSupports(CVar10,(ApiType)0x104);
              if ((!bVar8) &&
                 (bVar8 = glu::ContextInfo::isExtensionSupported
                                    (((this->super_TestCase).m_context)->m_contextInfo,
                                     "GL_ARB_tessellation_shader"), !bVar8)) goto LAB_00919ca2;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&cs_body,
                       "#version 150\n\n#extension GL_ARB_compute_shader          : require\n#extension GL_ARB_cull_distance           : require\n#extension GL_ARB_shader_image_load_store : require\n\nlayout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n\nlayout(r32i) uniform writeonly iimage2D result;\n\nvoid main()\n{\n    imageStore(result, ivec2(0),ivec4(TOKEN) );\n}\n"
                       ,(allocator<char> *)clear_values);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&fs_body,
                       "#version 150\n\n#extension GL_ARB_cull_distance : require\n\nflat in  int INPUT_FS_NAME;\nout int out_fs;\n\nvoid main()\n{\n    if (INPUT_FS_NAME == TOKEN)\n    {\n        out_fs = TOKEN;\n    }\n    else\n    {\n        out_fs = -1;\n    }\n}\n"
                       ,(allocator<char> *)clear_values);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&gs_body,
                       "#version 150\n\n#extension GL_ARB_cull_distance : require\n\nflat in  int INPUT_GS_NAME[];\nflat out int out_gs;\n\nlayout(points)                           in;\nlayout(triangle_strip, max_vertices = 4) out;\n\nvoid main()\n{\n    int result_value = (INPUT_GS_NAME[0] == TOKEN) ? TOKEN : -1;\n\n    gl_Position = vec4(-1.0, 1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n\n    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n\n    gl_Position = vec4(1.0, 1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n\n    gl_Position = vec4(1.0, -1.0, 0.0, 1.0);\n    out_gs      = result_value;\n    EmitVertex();\n    EndPrimitive();\n}\n"
                       ,(allocator<char> *)clear_values);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&tc_body,
                       "#version 400\n\n#extension GL_ARB_cull_distance : require\n\nlayout(vertices = 1) out;\n\nflat in  int INPUT_TC_NAME[];\nflat out int out_tc       [];\n\nvoid main()\n{\n    int result_value = (INPUT_TC_NAME[0] == TOKEN) ? TOKEN : -1;\n\n    out_tc[gl_InvocationID]             = result_value;\n    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n    gl_TessLevelInner[0]                = 1.0;\n    gl_TessLevelInner[1]                = 1.0;\n    gl_TessLevelOuter[0]                = 1.0;\n    gl_TessLevelOuter[1]                = 1.0;\n    gl_TessLevelOuter[2]                = 1.0;\n    gl_TessLevelOuter[3]                = 1.0;\n}\n"
                       ,(allocator<char> *)clear_values);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&te_body,
                       "#version 400\n\n#extension GL_ARB_cull_distance : require\n\nflat in  int INPUT_TE_NAME[];\nflat out int out_te;\n\nlayout(isolines, point_mode) in;\n\nvoid main()\n{\n    int result_value = (INPUT_TE_NAME[0] == TOKEN) ? TOKEN : 0;\n\n    out_te = result_value;\n\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.);\n}\n"
                       ,(allocator<char> *)clear_values);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&vs_body,
                       "#version 150\n\n#extension GL_ARB_cull_distance : require\n\nflat out int out_vs;\n\nvoid main()\n{\n    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n    out_vs      = TOKEN;\n}\n"
                       ,(allocator<char> *)clear_values);
            shader_bodies[0].body_ptr = &cs_body;
            shader_bodies[0].gl_type = 0x91b9;
            shader_bodies[1].body_ptr = &fs_body;
            shader_bodies[1].gl_type = 0x8b30;
            shader_bodies[2].body_ptr = &gs_body;
            shader_bodies[2].gl_type = 0x8dd9;
            shader_bodies[3].body_ptr = &tc_body;
            shader_bodies[3].gl_type = 0x8e88;
            shader_bodies[4].body_ptr = &te_body;
            shader_bodies[4].gl_type = 0x8e87;
            shader_bodies[5].body_ptr = &vs_body;
            shader_bodies[5].gl_type = 0x8b31;
            for (lVar23 = 0; pGVar5 = local_338, lVar23 != 6; lVar23 = lVar23 + 1) {
              GVar11 = shader_bodies[lVar23].gl_type;
              if (GVar11 == 0x8b30) {
                if (iterate::stages[lVar14].use_fs == true) {
                  clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                  clear_values._8_8_ = p_Var18->essl_token_value;
                  goto LAB_00919808;
                }
              }
              else if (GVar11 == 0x8b31) {
                if (iterate::stages[lVar14].use_vs == true) {
LAB_00919698:
                  clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                  clear_values._8_8_ = p_Var18->essl_token_value;
                  goto LAB_00919808;
                }
              }
              else if (GVar11 == 0x8e87) {
                if (iterate::stages[lVar14].use_te == true) {
                  clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                  clear_values._8_8_ = p_Var18->essl_token_value;
                  goto LAB_00919808;
                }
              }
              else if (GVar11 == 0x8e88) {
                if (bVar7 != false) {
                  clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                  clear_values._8_8_ = p_Var18->essl_token_value;
                  goto LAB_00919808;
                }
              }
              else if (GVar11 == 0x91b9) {
                if (bVar6 != false) goto LAB_00919698;
              }
              else {
                clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                clear_values._8_8_ = p_Var18->essl_token_value;
                if (GVar11 != 0x8dd9) {
                  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar17,"Unrecognized shader body type",(char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                             ,0x379);
                  __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
                }
LAB_00919808:
                clear_values._0_8_ = (long)"VERTICES_TOKEN" + 9;
                local_320 = shader_bodies + lVar23;
                local_378 = lVar23;
                for (lVar24 = 0; lVar23 = local_378, gl = local_328, lVar24 != 2;
                    lVar24 = lVar24 + 1) {
                  pcVar20 = *(char **)(clear_values + lVar24 * 4);
                  if ((pcVar20 != (char *)0x0) && (*(long *)(clear_values + lVar24 * 4 + 2) != 0)) {
                    psVar4 = local_320->body_ptr;
                    while (uVar12 = std::__cxx11::string::find((char *)psVar4,(ulong)pcVar20),
                          uVar12 != 0xffffffffffffffff) {
                      pcVar13 = (char *)strlen(pcVar20);
                      std::__cxx11::string::replace((ulong)psVar4,uVar12,pcVar13);
                    }
                  }
                }
              }
            }
            cs_body_00._M_p = (GLchar *)0x0;
            if (bVar6 != false) {
              cs_body_00._M_p = cs_body._M_dataplus._M_p;
            }
            bVar8 = iterate::stages[lVar14].use_fs;
            fs_body_00._M_p = (GLchar *)0x0;
            if (bVar8 != false) {
              fs_body_00._M_p = fs_body._M_dataplus._M_p;
            }
            gs_body_00._M_p = (GLchar *)0x0;
            if (iterate::stages[lVar14].use_gs != false) {
              gs_body_00._M_p = gs_body._M_dataplus._M_p;
            }
            tc_body_00._M_p = (GLchar *)0x0;
            if (bVar7 != false) {
              tc_body_00._M_p = tc_body._M_dataplus._M_p;
            }
            te_body_00._M_p = (GLchar *)0x0;
            if (iterate::stages[lVar14].use_te != false) {
              te_body_00._M_p = te_body._M_dataplus._M_p;
            }
            vs_body_00._M_p = (GLchar *)0x0;
            if (iterate::stages[lVar14].use_vs != false) {
              vs_body_00._M_p = vs_body._M_dataplus._M_p;
            }
            clear_values[0] = (uint)(iterate::stages[lVar14].tf_output_name != (GLchar *)0x0);
            Utilities::buildProgram
                      (gl,(this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                       cs_body_00._M_p,fs_body_00._M_p,gs_body_00._M_p,tc_body_00._M_p,
                       te_body_00._M_p,vs_body_00._M_p,(GLuint *)clear_values,
                       &iterate::stages[lVar14].tf_output_name,local_338);
            (*gl->useProgram)(*pGVar5);
            GVar11 = (*gl->getError)();
            glu::checkError(GVar11,"glUseProgram() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x398);
            if (bVar6 == false) {
              (*gl->beginTransformFeedback)(iterate::stages[lVar14].tf_mode);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glBeginTransformFeedback() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a1);
              (*gl->drawArrays)(iterate::stages[lVar14].draw_call_mode,0,
                                iterate::stages[lVar14].n_draw_call_vertices);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glDrawArrays() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a5);
              (*gl->endTransformFeedback)();
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glEndTransformFeedback() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3a8);
              value = (int *)(*gl->mapBufferRange)(0x8c8e,0,4,1);
              GVar11 = (*gl->getError)();
              glu::checkError(GVar11,"glMapBufferRange() call failed.",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                              ,0x3ba);
              if (*value == *local_360) {
                if (*local_368 <= *value) {
                  (*gl->unmapBuffer)(0x8c8e);
                  GVar11 = (*gl->getError)();
                  glu::checkError(GVar11,"glUnmapBuffer() call failed.",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                  ,0x3d5);
                  goto LAB_00919ad9;
                }
                clear_values._0_8_ =
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                pMVar16 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)clear_values,&runs[lVar15].name);
                std::operator<<(&(pMVar16->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ," value [");
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,value);
                std::operator<<(&(pMVar16->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"] does not meet the minimum specification requirements [");
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,local_368);
                std::operator<<(&(pMVar16->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"]");
                tcu::MessageBuilder::operator<<
                          (pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar17,
                           "GL constant value does not meet minimum specification requirements",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                           ,0x3d1);
              }
              else {
                clear_values._0_8_ =
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                pMVar16 = tcu::MessageBuilder::operator<<
                                    ((MessageBuilder *)clear_values,&runs[lVar15].name);
                std::operator<<(&(pMVar16->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ," value [");
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,value);
                std::operator<<(&(pMVar16->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"] does not match the one reported by glGetIntegerv() [");
                pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,local_360);
                std::operator<<(&(pMVar16->m_str).super_basic_ostream<char,_std::char_traits<char>_>
                                ,"]");
                tcu::MessageBuilder::operator<<
                          (pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                tcu::TestError::TestError
                          (pTVar17,"GL constant value does not match the ES SL equivalent",
                           (char *)0x0,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                           ,0x3c5);
              }
              __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
            }
            (*gl->dispatchCompute)(1,1,1);
            GVar11 = (*gl->getError)();
            glu::checkError(GVar11,"glDispatchCompute() call failed.",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                            ,0x3af);
LAB_00919ad9:
            iVar9 = 2;
LAB_00919adc:
            do {
              iVar21 = iVar9 + -1;
              if (iVar9 == 0) goto LAB_00919bd4;
              pGVar19 = local_350;
              if (iVar9 == 2) {
                pGVar19 = local_348;
              }
              cVar3 = bVar8;
              if (iVar9 == 2) {
                cVar3 = bVar6;
              }
              iVar9 = iVar21;
              if (cVar3 != '\0') {
                result_value = 0;
                (*gl->framebufferTexture2D)(0x8ca8,0x8ce0,0xde1,*pGVar19,0);
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"glFramebufferTexture2D() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,1000);
                (*gl->finish)();
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"glMemoryBarrier() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,0x3ed);
                (*gl->readPixels)(0,0,1,1,0x8d94,0x1404,&result_value);
                GVar11 = (*gl->getError)();
                glu::checkError(GVar11,"glReadPixels() call failed.",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                                ,0x3f4);
                if (result_value == *local_360) {
                  if (*local_368 <= result_value) goto LAB_00919adc;
                  clear_values._0_8_ =
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                  pMVar16 = tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)clear_values,&runs[lVar15].name);
                  poVar1 = &pMVar16->m_str;
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  " value accessible to the compute / fragment shader [");
                  std::ostream::operator<<(poVar1,result_value);
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "] does not meet the minimum specification requirements [");
                  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,local_368);
                  std::operator<<(&(pMVar16->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,"]");
                  tcu::MessageBuilder::operator<<
                            (pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar17,
                             "GL constant value does not meet minimum specification requirements",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                             ,0x40d);
                }
                else {
                  clear_values._0_8_ =
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)(clear_values + 2));
                  pMVar16 = tcu::MessageBuilder::operator<<
                                      ((MessageBuilder *)clear_values,&runs[lVar15].name);
                  poVar1 = &pMVar16->m_str;
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  " value accessible to the compute / fragment shader [");
                  std::ostream::operator<<(poVar1,result_value);
                  std::operator<<(&poVar1->super_basic_ostream<char,_std::char_traits<char>_>,
                                  "] does not match the one reported by glGetIntegerv() [");
                  pMVar16 = tcu::MessageBuilder::operator<<(pMVar16,local_360);
                  std::operator<<(&(pMVar16->m_str).
                                   super_basic_ostream<char,_std::char_traits<char>_>,"]");
                  tcu::MessageBuilder::operator<<
                            (pMVar16,(EndMessageToken *)&tcu::TestLog::EndMessage);
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
                  pTVar17 = (TestError *)__cxa_allocate_exception(0x38);
                  tcu::TestError::TestError
                            (pTVar17,"GL constant value does not match the ES SL equivalent",
                             (char *)0x0,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                             ,0x400);
                }
                __cxa_throw(pTVar17,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
              }
            } while( true );
          }
          CVar10.super_ApiType.m_bits =
               (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])()
          ;
          bVar7 = glu::contextSupports(CVar10,(ApiType)0x134);
          if ((bVar7) ||
             (bVar7 = glu::ContextInfo::isExtensionSupported
                                (((this->super_TestCase).m_context)->m_contextInfo,
                                 "GL_ARB_compute_shader"), bVar7)) goto LAB_0091949f;
          goto LAB_00919ca2;
        }
        lVar15 = local_340 + 1;
      }
      this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      pcVar20 = "Pass";
      testResult = QP_TEST_RESULT_PASS;
      goto LAB_00918ffb;
    }
    clear_values._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(clear_values + 2);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"glGetIntegerv() returned error code ");
    std::operator<<((ostream *)poVar2,"[");
    shader_bodies[0].body_ptr = (string *)glu::getErrorName;
    shader_bodies[0].gl_type = GVar11;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)shader_bodies,(ostream *)poVar2);
    std::operator<<((ostream *)poVar2,
                    "] for GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES query instead of GL_NO_ERROR");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)clear_values,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    clear_values._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    poVar2 = (ostringstream *)(clear_values + 2);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    std::operator<<((ostream *)poVar2,"glGetIntegerv() returned error code ");
    std::operator<<((ostream *)poVar2,"[");
    shader_bodies[0].body_ptr = (string *)glu::getErrorName;
    shader_bodies[0].gl_type = GVar11;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)shader_bodies,(ostream *)poVar2);
    std::operator<<((ostream *)poVar2,"] for GL_MAX_CULL_DISTANCES query instead of GL_NO_ERROR");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)clear_values,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(clear_values + 2));
  this_01 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  pcVar20 = "Fail";
  testResult = QP_TEST_RESULT_FAIL;
LAB_00918ffb:
  tcu::TestContext::setTestResult(this_01,testResult,pcVar20);
  return STOP;
LAB_00919bd4:
  (*gl->bufferSubData)(0x8c8e,0,0x40,"");
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glBufferSubData() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                  ,0x416);
  clear_values[0] = 0;
  clear_values[1] = 0;
  clear_values[2] = 0;
  clear_values[3] = 0;
  (*gl->clearBufferiv)(0x1800,0,clear_values);
  GVar11 = (*gl->getError)();
  glu::checkError(GVar11,"glClearBufferiv() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cCullDistanceTests.cpp"
                  ,0x41d);
  if (*pGVar5 != 0) {
    (*gl->deleteProgram)(*pGVar5);
    *pGVar5 = 0;
  }
  std::__cxx11::string::~string((string *)&vs_body);
  std::__cxx11::string::~string((string *)&te_body);
  std::__cxx11::string::~string((string *)&tc_body);
  std::__cxx11::string::~string((string *)&gs_body);
  std::__cxx11::string::~string((string *)&fs_body);
  std::__cxx11::string::~string((string *)&cs_body);
LAB_00919ca2:
  lVar14 = local_330 + 1;
  goto LAB_00919430;
}

Assistant:

tcu::TestNode::IterateResult CullDistance::APICoverageTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* This test should only be executed if ARB_cull_distance is supported, or if
	 * we're running a GL4.5 context
	 */
	if (!m_context.getContextInfo().isExtensionSupported("GL_ARB_cull_distance") &&
		!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)))
	{
		throw tcu::NotSupportedError("GL_ARB_cull_distance is not supported");
	}

	/* Check that calling GetIntegerv with MAX_CULL_DISTANCES doesn't generate
	 * any errors and returns a value at least 8.
	 *
	 * Check that calling GetIntegerv with MAX_COMBINED_CLIP_AND_CULL_DISTANCES
	 * doesn't generate any errors and returns a value at least 8.
	 *
	 */
	glw::GLint error_code									 = GL_NO_ERROR;
	glw::GLint gl_max_cull_distances_value					 = 0;
	glw::GLint gl_max_combined_clip_and_cull_distances_value = 0;

	gl.getIntegerv(GL_MAX_CULL_DISTANCES, &gl_max_cull_distances_value);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned error code "
						   << "[" << glu::getErrorStr(error_code) << "] for GL_MAX_CULL_DISTANCES"
																	 " query instead of GL_NO_ERROR"
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	gl.getIntegerv(GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES, &gl_max_combined_clip_and_cull_distances_value);

	error_code = gl.getError();
	if (error_code != GL_NO_ERROR)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "glGetIntegerv() returned error code "
						   << "[" << glu::getErrorStr(error_code) << "] for "
																	 "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES query "
																	 "instead of GL_NO_ERROR"
						   << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");

		return STOP;
	}

	/* Before we proceed with the two other tests, initialize a buffer & a texture
	 * object we will need to capture data from the programs */
	static const glw::GLuint bo_size = sizeof(int) * 4 /* components */ * 4 /* result points */;

	gl.genBuffers(1, &m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers() call failed.");

	gl.genFramebuffers(1, &m_fbo_draw_id);
	gl.genFramebuffers(1, &m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers() call(s) failed.");

	gl.genTextures(1, &m_cs_to_id);
	gl.genTextures(1, &m_fbo_draw_to_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenTextures() call failed.");

	gl.genVertexArrays(1, &m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays() call failed.");

	gl.bindVertexArray(m_vao_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray() call failed.");

	gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
	gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* index */
					  m_bo_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() or glBindBufferBase() call(s) failed.");

	gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() call failed.");

	for (glw::GLuint n_to_id = 0; n_to_id < 2; /* CS, FBO */ ++n_to_id)
	{
		gl.bindTexture(GL_TEXTURE_2D, (n_to_id == 0) ? m_cs_to_id : m_fbo_draw_to_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindTexture() call failed.");

		gl.texStorage2D(GL_TEXTURE_2D, 1, /* levels */
						GL_R32I, 1,		  /* width */
						1);				  /* height */
		GLU_EXPECT_NO_ERROR(gl.getError(), "glTexStorage2D() call failed.");
	}

	gl.bindImageTexture(0,			   /* unit */
						m_cs_to_id, 0, /* level */
						GL_FALSE,	  /* layered */
						0,			   /* layer */
						GL_WRITE_ONLY, GL_R32I);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindImageTexture() call failed.");

	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, m_fbo_draw_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, m_fbo_draw_to_id, 0); /* level */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, m_fbo_read_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer() call failed.");

	gl.viewport(0,  /* x */
				0,  /* y */
				1,  /* width */
				1); /* height */
	GLU_EXPECT_NO_ERROR(gl.getError(), "glViewport() call failed.");

	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPixelStorei() call failed.");

	/* There are two new GL constants, where value we need to verify */
	struct _run
	{
		const glw::GLchar* essl_token_value;
		glw::GLenum		   gl_enum;
		glw::GLint		   gl_value;
		glw::GLint		   min_value;
		const glw::GLchar* name;
	} runs[] = { { "gl_MaxCullDistances", GL_MAX_CULL_DISTANCES, gl_max_cull_distances_value, 8 /*minimum required */,
				   "GL_MAX_CULL_DISTANCES" },
				 { "gl_MaxCombinedClipAndCullDistances", GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES,
				   gl_max_combined_clip_and_cull_distances_value, 8 /*minimum required */,
				   "GL_MAX_COMBINED_CLIP_AND_CULL_DISTANCES" } };

	static const glw::GLuint n_runs = sizeof(runs) / sizeof(runs[0]);

	for (glw::GLuint n_run = 0; n_run < n_runs; ++n_run)
	{
		_run& current_run = runs[n_run];

		static const struct _stage
		{
			bool use_cs;
			bool use_fs;
			bool use_gs;
			bool use_tc;
			bool use_te;
			bool use_vs;

			const glw::GLchar* fs_input;
			const glw::GLchar* gs_input;
			const glw::GLchar* tc_input;
			const glw::GLchar* te_input;

			const glw::GLchar* tf_output_name;
			const glw::GLenum  tf_mode;

			glw::GLenum draw_call_mode;
			glw::GLuint n_draw_call_vertices;
		} stages[] = { /* CS only test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   true, false, false, false, false, false,

						   NULL,	/* fs_input             */
						   NULL,	/* gs_input             */
						   NULL,	/* tc_input             */
						   NULL,	/* te_input             */
						   NULL,	/* tf_output_name       */
						   GL_NONE, /* tf_mode              */
						   GL_NONE, /* draw_call_mode       */
						   0,		/* n_draw_call_vertices */
					   },
					   /* VS+GS+TC+TE+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, true, true, true, true,

						   "out_gs",	 /* fs_input             */
						   "out_te",	 /* gs_input             */
						   "out_vs",	 /* tc_input             */
						   "out_tc",	 /* te_input             */
						   "out_gs",	 /* tf_output_name       */
						   GL_TRIANGLES, /* tf_mode              */
						   GL_PATCHES,   /* draw_call_mode       */
						   3,			 /* n_draw_call_vertices */
					   },
					   /* VS+GS+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, true, false, false, true,

						   "out_gs",	 /* fs_input             */
						   "out_vs",	 /* gs_input             */
						   NULL,		 /* tc_input             */
						   NULL,		 /* te_input             */
						   "out_gs",	 /* tf_output_name       */
						   GL_TRIANGLES, /* tf_mode              */
						   GL_POINTS,	/* draw_call_mode       */
						   1,			 /* n_draw_call_vertices */
					   },
					   /* VS+TC+TE+FS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, true, false, true, true, true,

						   "out_te",   /* fs_input             */
						   NULL,	   /* gs_input             */
						   "out_vs",   /* tc_input             */
						   "out_tc",   /* te_input             */
						   "out_te",   /* tf_output_name       */
						   GL_POINTS,  /* tf_mode              */
						   GL_PATCHES, /* draw_call_mode       */
						   3		   /* n_draw_call_vertices */
					   },
					   /* VS test */
					   {
						   /* use_cs|use_fs|use_gs|use_tc|use_te|use_vs */
						   false, false, false, false, false, true,

						   "out_vs",  /* fs_input             */
						   NULL,	  /* gs_input             */
						   NULL,	  /* tc_input             */
						   NULL,	  /* te_input             */
						   "out_vs",  /* tf_output_name       */
						   GL_POINTS, /* tf_mode              */
						   GL_POINTS, /* draw_call_mode       */
						   1		  /* n_draw_call_vertices */
					   }
		};
		const glw::GLuint n_stages = sizeof(stages) / sizeof(stages[0]);

		/* Run through all test stages */
		for (glw::GLuint n_stage = 0; n_stage < n_stages; ++n_stage)
		{
			/* Check for OpenGL feature support */
			if (stages[n_stage].use_cs)
			{
				if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 3)) &&
					!m_context.getContextInfo().isExtensionSupported("GL_ARB_compute_shader"))
				{
					continue; // no compute shader support
				}
			}
			if (stages[n_stage].use_tc || stages[n_stage].use_te)
			{
				if (!glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)) &&
					!m_context.getContextInfo().isExtensionSupported("GL_ARB_tessellation_shader"))
				{
					continue; // no tessellation shader support
				}
			}

			/* Check that use of the GLSL built-in constant gl_MaxCullDistance in any
			 * shader stage (including compute shader) does not affect the shader
			 * compilation & program linking process.
			 */
			static const glw::GLchar* cs_body_template =
				"#version 150\n"
				"\n"
				"#extension GL_ARB_compute_shader          : require\n"
				"#extension GL_ARB_cull_distance           : require\n"
				"#extension GL_ARB_shader_image_load_store : require\n"
				"\n"
				"layout(local_size_x = 1, local_size_y = 1, local_size_z = 1) in;\n"
				"\n"
				"layout(r32i) uniform writeonly iimage2D result;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    imageStore(result, ivec2(0),ivec4(TOKEN) );\n"
				"}\n";
			std::string cs_body = cs_body_template;

			static const glw::GLchar* fs_body_template = "#version 150\n"
														 "\n"
														 "#extension GL_ARB_cull_distance : require\n"
														 "\n"
														 "flat in  int INPUT_FS_NAME;\n"
														 "out int out_fs;\n"
														 "\n"
														 "void main()\n"
														 "{\n"
														 "    if (INPUT_FS_NAME == TOKEN)\n"
														 "    {\n"
														 "        out_fs = TOKEN;\n"
														 "    }\n"
														 "    else\n"
														 "    {\n"
														 "        out_fs = -1;\n"
														 "    }\n"
														 "}\n";
			std::string fs_body = fs_body_template;

			static const glw::GLchar* gs_body_template =
				"#version 150\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"flat in  int INPUT_GS_NAME[];\n"
				"flat out int out_gs;\n"
				"\n"
				"layout(points)                           in;\n"
				"layout(triangle_strip, max_vertices = 4) out;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_GS_NAME[0] == TOKEN) ? TOKEN : -1;\n"
				"\n"
				/* Draw a full-screen quad */
				"    gl_Position = vec4(-1.0, 1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(-1.0, -1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(1.0, 1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"\n"
				"    gl_Position = vec4(1.0, -1.0, 0.0, 1.0);\n"
				"    out_gs      = result_value;\n"
				"    EmitVertex();\n"
				"    EndPrimitive();\n"
				"}\n";
			std::string gs_body = gs_body_template;

			static const glw::GLchar* tc_body_template =
				"#version 400\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"layout(vertices = 1) out;\n"
				"\n"
				"flat in  int INPUT_TC_NAME[];\n"
				"flat out int out_tc       [];\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_TC_NAME[0] == TOKEN) ? TOKEN : -1;\n"
				"\n"
				"    out_tc[gl_InvocationID]             = result_value;\n"
				"    gl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n"
				"    gl_TessLevelInner[0]                = 1.0;\n"
				"    gl_TessLevelInner[1]                = 1.0;\n"
				"    gl_TessLevelOuter[0]                = 1.0;\n"
				"    gl_TessLevelOuter[1]                = 1.0;\n"
				"    gl_TessLevelOuter[2]                = 1.0;\n"
				"    gl_TessLevelOuter[3]                = 1.0;\n"
				"}\n";
			std::string tc_body = tc_body_template;

			static const glw::GLchar* te_body_template =
				"#version 400\n"
				"\n"
				"#extension GL_ARB_cull_distance : require\n"
				"\n"
				"flat in  int INPUT_TE_NAME[];\n"
				"flat out int out_te;\n"
				"\n"
				"layout(isolines, point_mode) in;\n"
				"\n"
				"void main()\n"
				"{\n"
				"    int result_value = (INPUT_TE_NAME[0] == TOKEN) ? TOKEN : 0;\n"
				"\n"
				"    out_te = result_value;\n"
				"\n"
				"    gl_Position = vec4(0.0, 0.0, 0.0, 1.);\n"
				"}\n";
			std::string te_body = te_body_template;

			static const glw::GLchar* vs_body_template = "#version 150\n"
														 "\n"
														 "#extension GL_ARB_cull_distance : require\n"
														 "\n"
														 "flat out int out_vs;\n"
														 "\n"
														 "void main()\n"
														 "{\n"
														 "    gl_Position = vec4(0.0, 0.0, 0.0, 1.0);\n"
														 "    out_vs      = TOKEN;\n"
														 "}\n";
			std::string vs_body = vs_body_template;

			const _stage& current_stage = stages[n_stage];

			/* Build shader bodies */
			struct _shader_body
			{
				std::string* body_ptr;
				glw::GLenum  gl_type;
			} shader_bodies[] = { { &cs_body, GL_COMPUTE_SHADER },		   { &fs_body, GL_FRAGMENT_SHADER },
								  { &gs_body, GL_GEOMETRY_SHADER },		   { &tc_body, GL_TESS_CONTROL_SHADER },
								  { &te_body, GL_TESS_EVALUATION_SHADER }, { &vs_body, GL_VERTEX_SHADER } };
			static const glw::GLchar* input_fs_token_string = "INPUT_FS_NAME";
			static const glw::GLchar* input_gs_token_string = "INPUT_GS_NAME";
			static const glw::GLchar* input_te_token_string = "INPUT_TE_NAME";
			static const glw::GLchar* input_tc_token_string = "INPUT_TC_NAME";
			static const glw::GLuint  n_shader_bodies		= sizeof(shader_bodies) / sizeof(shader_bodies[0]);

			std::size_t				  token_position = std::string::npos;
			static const glw::GLchar* token_string   = "TOKEN";

			for (glw::GLuint n_shader_body = 0; n_shader_body < n_shader_bodies; ++n_shader_body)
			{
				_shader_body& current_body = shader_bodies[n_shader_body];

				/* Is this stage actually used? */
				if (((current_body.gl_type == GL_COMPUTE_SHADER) && (!current_stage.use_cs)) ||
					((current_body.gl_type == GL_FRAGMENT_SHADER) && (!current_stage.use_fs)) ||
					((current_body.gl_type == GL_TESS_CONTROL_SHADER) && (!current_stage.use_tc)) ||
					((current_body.gl_type == GL_TESS_EVALUATION_SHADER) && (!current_stage.use_te)) ||
					((current_body.gl_type == GL_VERTEX_SHADER) && (!current_stage.use_vs)))
				{
					/* Skip the iteration. */
					continue;
				}

				/* Iterate over all token and replace them with stage-specific values */
				struct _token_value_pair
				{
					const glw::GLchar* token;
					const glw::GLchar* value;
				} token_value_pairs[] = {
					/* NOTE: The last entry is filled by the switch() block below */
					{ token_string, current_run.essl_token_value },
					{ NULL, NULL },
				};

				const size_t n_token_value_pairs = sizeof(token_value_pairs) / sizeof(token_value_pairs[0]);

				switch (current_body.gl_type)
				{
				case GL_COMPUTE_SHADER:
				case GL_VERTEX_SHADER:
					break;

				case GL_FRAGMENT_SHADER:
				{
					token_value_pairs[1].token = input_fs_token_string;
					token_value_pairs[1].value = current_stage.fs_input;

					break;
				}

				case GL_GEOMETRY_SHADER:
				{
					token_value_pairs[1].token = input_gs_token_string;
					token_value_pairs[1].value = current_stage.gs_input;

					break;
				}

				case GL_TESS_CONTROL_SHADER:
				{
					token_value_pairs[1].token = input_tc_token_string;
					token_value_pairs[1].value = current_stage.tc_input;

					break;
				}

				case GL_TESS_EVALUATION_SHADER:
				{
					token_value_pairs[1].token = input_te_token_string;
					token_value_pairs[1].value = current_stage.te_input;

					break;
				}

				default:
					TCU_FAIL("Unrecognized shader body type");
				}

				for (glw::GLuint n_pair = 0; n_pair < n_token_value_pairs; ++n_pair)
				{
					const _token_value_pair& current_pair = token_value_pairs[n_pair];

					if (current_pair.token == NULL || current_pair.value == NULL)
					{
						continue;
					}

					while ((token_position = current_body.body_ptr->find(current_pair.token)) != std::string::npos)
					{
						current_body.body_ptr->replace(token_position, strlen(current_pair.token), current_pair.value);
					}
				} /* for (all token+value pairs) */
			}	 /* for (all sader bodies) */

			/* Build the test program */
			CullDistance::Utilities::buildProgram(
				gl, m_testCtx, current_stage.use_cs ? cs_body.c_str() : DE_NULL,
				current_stage.use_fs ? fs_body.c_str() : DE_NULL, current_stage.use_gs ? gs_body.c_str() : DE_NULL,
				current_stage.use_tc ? tc_body.c_str() : DE_NULL, current_stage.use_te ? te_body.c_str() : DE_NULL,
				current_stage.use_vs ? vs_body.c_str() : DE_NULL, (current_stage.tf_output_name != NULL) ? 1 : 0,
				(const glw::GLchar**)&current_stage.tf_output_name, &m_po_id);

			/* Bind the test program */
			DE_ASSERT(m_po_id != 0);

			gl.useProgram(m_po_id);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

			/* Execute the draw call. Transform Feed-back should be enabled for all iterations
			 * par the CS one, since we use a different tool to capture the result data in the
			 * latter case.
			 */
			if (!current_stage.use_cs)
			{
				gl.beginTransformFeedback(current_stage.tf_mode);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() call failed.");

				gl.drawArrays(current_stage.draw_call_mode, 0,	 /* first */
							  current_stage.n_draw_call_vertices); /* count */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed.");

				gl.endTransformFeedback();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed.");
			} /* if (uses_tf) */
			else
			{
				gl.dispatchCompute(1,  /* num_groups_x */
								   1,  /* num_groups_y */
								   1); /* num_groups_z */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute() call failed.");
			}

			/* Verify the result values */
			if (!current_stage.use_cs)
			{
				glw::GLint* result_data_ptr = DE_NULL;

				/* Retrieve the data captured by Transform Feedback */
				result_data_ptr = (glw::GLint*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
																 sizeof(unsigned int) * 1, GL_MAP_READ_BIT);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

				if (*result_data_ptr != current_run.gl_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name << " value "
																					   "["
									   << *result_data_ptr << "]"
															  " does not match the one reported by glGetIntegerv() "
															  "["
									   << current_run.gl_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not match the ES SL equivalent");
				}

				if (*result_data_ptr < current_run.min_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name << " value "
																					   "["
									   << *result_data_ptr << "]"
															  " does not meet the minimum specification requirements "
															  "["
									   << current_run.min_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not meet minimum specification requirements");
				}

				gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");
			}

			for (glw::GLuint n_stage_internal = 0; n_stage_internal < 2; /* CS, FS write to separate textures */
				 ++n_stage_internal)
			{
				glw::GLuint to_id = (n_stage_internal == 0) ? m_cs_to_id : m_fbo_draw_to_id;

				if (((n_stage_internal == 0) && (!current_stage.use_cs)) ||
					((n_stage_internal == 1) && (!current_stage.use_fs)))
				{
					/* Skip the iteration */
					continue;
				}

				/* Check the image data the test CS / FS should have written */
				glw::GLint result_value = 0;

				gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, to_id, 0); /* level */
				GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferTexture2D() call failed.");

				/* NOTE: We're using our custom read framebuffer here, so we'll be reading
				 *       from the texture, that the writes have been issued to earlier. */
				gl.finish();
				GLU_EXPECT_NO_ERROR(gl.getError(), "glMemoryBarrier() call failed.");

				gl.readPixels(0, /* x */
							  0, /* y */
							  1, /* width */
							  1, /* height */
							  GL_RED_INTEGER, GL_INT, &result_value);
				GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed.");

				if (result_value != current_run.gl_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name
									   << " value accessible to the compute / fragment shader "
										  "["
									   << result_value << "]"
														  " does not match the one reported by glGetIntegerv() "
														  "["
									   << current_run.gl_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not match the ES SL equivalent");
				}

				if (result_value < current_run.min_value)
				{
					m_testCtx.getLog() << tcu::TestLog::Message << current_run.name
									   << " value accessible to the compute / fragment shader "
										  "["
									   << result_value << "]"
														  " does not meet the minimum specification requirements "
														  "["
									   << current_run.min_value << "]" << tcu::TestLog::EndMessage;

					TCU_FAIL("GL constant value does not meet minimum specification requirements");
				}
			}

			/* Clear the data buffer before we continue */
			static const glw::GLubyte bo_clear_data[bo_size] = { 0 };

			gl.bufferSubData(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
							 bo_size, bo_clear_data);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferSubData() call failed.");

			/* Clear the texture mip-map before we continue */
			glw::GLint clear_values[4] = { 0, 0, 0, 0 };

			gl.clearBufferiv(GL_COLOR, 0, /* drawbuffer */
							 clear_values);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glClearBufferiv() call failed.");

			/* Release program before we move on to the next iteration */
			if (m_po_id != 0)
			{
				gl.deleteProgram(m_po_id);

				m_po_id = 0;
			}
		} /* for (all stages) */
	}	 /* for (both runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}